

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<unsigned_short,unsigned_int>(void)

{
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  uint uVar2;
  uint u;
  uint lhs;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2e;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  
  u = 0;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_int>(&local_2e,&u);
  su.m_int = u;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_int>(&st2,&su);
  local_2e.m_int = 0;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &local_2e,&u);
  if (su.m_int < 0x10000) {
    local_2e.m_int = st2.m_int;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
              (&local_2e,st2);
    operator*(u,local_2e);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,su);
    uVar2 = 1;
    u = uVar2;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,(int *)&stack0xffffffffffffffcc);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
               (int *)&stack0xffffffffffffffcc);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               (int *)&stack0xffffffffffffffcc);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              (&local_2e,st2);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,su);
    u = uVar2;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               (int *)&stack0xffffffffffffffcc);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,(int *)&stack0xffffffffffffffcc);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
              (&local_2e,st2);
    operator/(u,local_2e);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,su);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
              (&local_2e,st2);
    operator+(u,local_2e);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,su);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,(int *)&stack0xffffffffffffffcc);
    u = 0;
    lhs = 0;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               (int *)&stack0xffffffffffffffcc);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
              (&local_2e,st2);
    operator-(lhs,u._2_2_);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,(int *)&stack0xffffffffffffffcc);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
               (int *)&stack0xffffffffffffffcc);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,su);
    u = uVar2;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
               (int *)&stack0xffffffffffffffcc);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SVar1 = SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)&local_2e,su);
    operator<<(SVar1.m_int,su);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,su);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SVar1 = SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)&local_2e,su);
    operator>>(SVar1.m_int,su);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2e,su);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
              (&local_2e,st2);
    SafeInt::operator_cast_to_unsigned_short((SafeInt *)&stack0xffffffffffffffcc);
    local_2e.m_int = (ushort)u & (ushort)su.m_int & local_2e.m_int & st2.m_int;
    SafeInt::operator_cast_to_unsigned_short((SafeInt *)&stack0xffffffffffffffcc);
    local_2e.m_int = (ushort)su.m_int | (ushort)u | local_2e.m_int | st2.m_int;
    SafeInt::operator_cast_to_unsigned_short((SafeInt *)&stack0xffffffffffffffcc);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}